

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_pack_subscribe_request(uint8_t *buf,size_t bufsz,uint packet_id,...)

{
  char in_AL;
  size_t sVar1;
  uint8_t *buf_00;
  ssize_t sVar2;
  undefined1 *puVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 *local_1a8;
  undefined8 *local_190;
  undefined8 local_178 [4];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined1 auStack_c0 [8];
  uint8_t max_qos [8];
  char *topic [8];
  uint local_6c;
  uint local_68;
  uint i;
  uint num_subs;
  mqtt_fixed_header fixed_header;
  ssize_t rv;
  uint8_t *start;
  va_list args;
  uint packet_id_local;
  size_t bufsz_local;
  uint8_t *buf_local;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  local_68 = 0;
  args[0]._0_8_ = &stack0x00000008;
  start._0_4_ = 0x18;
  while( true ) {
    if ((uint)start < 0x29) {
      local_190 = (undefined8 *)((long)local_178 + (long)(int)(uint)start);
      start._0_4_ = (uint)start + 8;
    }
    else {
      local_190 = (undefined8 *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    topic[(ulong)local_68 - 1] = (char *)*local_190;
    if (topic[(ulong)local_68 - 1] == (char *)0x0) break;
    if ((uint)start < 0x29) {
      local_1a8 = (undefined4 *)((long)local_178 + (long)(int)(uint)start);
      start._0_4_ = (uint)start + 8;
    }
    else {
      local_1a8 = (undefined4 *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    auStack_c0[local_68] = (char)*local_1a8;
    local_68 = local_68 + 1;
    if (7 < local_68) {
      return -0x7ffffff5;
    }
  }
  i = 8;
  num_subs._0_1_ = (byte)num_subs & 0xf0 | 2;
  fixed_header.control_type = MQTT_CONTROL_CONNACK;
  local_178[3] = in_RCX;
  local_158 = in_R8;
  local_150 = in_R9;
  for (local_6c = 0; local_6c < local_68; local_6c = local_6c + 1) {
    sVar1 = strlen(topic[(ulong)local_6c - 1]);
    fixed_header.control_type = (int)sVar1 + 3 + fixed_header.control_type;
  }
  fixed_header._4_8_ = mqtt_pack_fixed_header(buf,bufsz,(mqtt_fixed_header *)&i);
  if ((long)fixed_header._4_8_ < 1) {
    return fixed_header._4_8_;
  }
  buf_00 = buf + fixed_header._4_8_;
  if (bufsz - fixed_header._4_8_ < (ulong)fixed_header.control_type) {
    return 0;
  }
  sVar2 = __mqtt_pack_uint16(buf_00,(uint16_t)packet_id);
  bufsz_local = (size_t)(buf_00 + sVar2);
  for (local_6c = 0; local_6c < local_68; local_6c = local_6c + 1) {
    sVar2 = __mqtt_pack_str((uint8_t *)bufsz_local,topic[(ulong)local_6c - 1]);
    puVar3 = (undefined1 *)(sVar2 + bufsz_local);
    bufsz_local = (size_t)(puVar3 + 1);
    *puVar3 = auStack_c0[local_6c];
  }
  return bufsz_local - (long)buf;
}

Assistant:

ssize_t mqtt_pack_subscribe_request(uint8_t *buf, size_t bufsz, unsigned int packet_id, ...) {
    va_list args;
    const uint8_t *const start = buf;
    ssize_t rv;
    struct mqtt_fixed_header fixed_header;
    unsigned int num_subs = 0;
    unsigned int i;
    const char *topic[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];
    uint8_t max_qos[MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS];

    /* parse all subscriptions */
    va_start(args, packet_id);
    for(;;) {
        topic[num_subs] = va_arg(args, const char*);
        if (topic[num_subs] == NULL) {
            /* end of list */
            break;
        }

        max_qos[num_subs] = (uint8_t) va_arg(args, unsigned int);

        ++num_subs;
        if (num_subs >= MQTT_SUBSCRIBE_REQUEST_MAX_NUM_TOPICS) {
            va_end(args);
            return MQTT_ERROR_SUBSCRIBE_TOO_MANY_TOPICS;
        }
    }
    va_end(args);

    /* build the fixed header */
    fixed_header.control_type = MQTT_CONTROL_SUBSCRIBE;
    fixed_header.control_flags = 2u;
    fixed_header.remaining_length = 2u; /* size of variable header */
    for(i = 0; i < num_subs; ++i) {
        /* payload is topic name + max qos (1 byte) */
        fixed_header.remaining_length += __mqtt_packed_cstrlen(topic[i]) + 1;
    }

    /* pack the fixed header */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        return rv;
    }
    buf += rv;
    bufsz -= (unsigned long)rv;

    /* check that the buffer has enough space */
    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }
    
    
    /* pack variable header */
    buf += __mqtt_pack_uint16(buf, (uint16_t)packet_id);


    /* pack payload */
    for(i = 0; i < num_subs; ++i) {
        buf += __mqtt_pack_str(buf, topic[i]);
        *buf++ = max_qos[i];
    }

    return buf - start;
}